

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

float __thiscall ImGuiMenuColumns::DeclColumns(ImGuiMenuColumns *this,float w0,float w1,float w2)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  int i;
  long lVar3;
  undefined1 in_register_00001204 [60];
  undefined1 auVar4 [64];
  float fVar5;
  undefined1 in_register_00001244 [60];
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  undefined1 in_register_00001284 [60];
  undefined1 auVar8 [64];
  undefined1 auVar9 [16];
  float fVar10;
  
  auVar8._4_60_ = in_register_00001284;
  auVar8._0_4_ = w2;
  auVar6._4_60_ = in_register_00001244;
  auVar6._0_4_ = w1;
  auVar4._4_60_ = in_register_00001204;
  auVar4._0_4_ = w0;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)this->NextWidths;
  auVar2 = vinsertps_avx(auVar4._0_16_,auVar6._0_16_,0x10);
  auVar7 = vcmpps_avx(auVar2,auVar9,2);
  auVar7 = vblendvps_avx(auVar2,auVar9,auVar7);
  uVar1 = vmovlps_avx(auVar7);
  *(undefined8 *)this->NextWidths = uVar1;
  auVar7 = vcmpss_avx(auVar8._0_16_,ZEXT416((uint)this->NextWidths[2]),2);
  auVar7 = vblendvps_avx(auVar8._0_16_,ZEXT416((uint)this->NextWidths[2]),auVar7);
  this->NextWidths[2] = auVar7._0_4_;
  auVar7._0_12_ = ZEXT412(0);
  auVar7._12_4_ = 0;
  lVar3 = 0;
  fVar5 = 0.0;
  do {
    if (lVar3 == 0) {
      fVar10 = 0.0;
    }
    else {
      auVar2 = vcmpss_avx(auVar7,ZEXT416((uint)this->NextWidths[lVar3]),1);
      auVar2 = vandps_avx(auVar2,ZEXT416((uint)this->Spacing));
      fVar10 = auVar2._0_4_;
    }
    fVar5 = fVar5 + this->NextWidths[lVar3] + fVar10;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  this->NextWidth = fVar5;
  auVar7 = vcmpss_avx(ZEXT416((uint)fVar5),ZEXT416((uint)this->Width),2);
  auVar7 = vblendvps_avx(ZEXT416((uint)fVar5),ZEXT416((uint)this->Width),auVar7);
  return auVar7._0_4_;
}

Assistant:

float ImGuiMenuColumns::DeclColumns(float w0, float w1, float w2) // not using va_arg because they promote float to double
{
    NextWidth = 0.0f;
    NextWidths[0] = ImMax(NextWidths[0], w0);
    NextWidths[1] = ImMax(NextWidths[1], w1);
    NextWidths[2] = ImMax(NextWidths[2], w2);
    for (int i = 0; i < IM_ARRAYSIZE(Pos); i++)
        NextWidth += NextWidths[i] + ((i > 0 && NextWidths[i] > 0.0f) ? Spacing : 0.0f);
    return ImMax(Width, NextWidth);
}